

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY name;
  STRING_POOL *pool;
  XML_Char XVar1;
  char cVar2;
  int iVar3;
  undefined1 *puVar4;
  XML_Char *pXVar5;
  ATTRIBUTE_ID *pAVar6;
  PREFIX *pPVar7;
  long lVar8;
  long lVar9;
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  puVar4 = *(undefined1 **)((long)parser + 0x348);
  if (puVar4 == *(undefined1 **)((long)parser + 0x340)) {
    iVar3 = poolGrow(pool);
    if (iVar3 == 0) {
      return (ATTRIBUTE_ID *)0x0;
    }
    puVar4 = *(undefined1 **)((long)parser + 0x348);
  }
  *(undefined1 **)((long)parser + 0x348) = puVar4 + 1;
  *puVar4 = 0;
  pXVar5 = poolStoreString(pool,enc,start,end);
  if (pXVar5 != (XML_Char *)0x0) {
    name = pXVar5 + 1;
    pAVar6 = (ATTRIBUTE_ID *)lookup((HASH_TABLE *)((long)parser + 0x2e0),name,0x18);
    if (pAVar6 != (ATTRIBUTE_ID *)0x0) {
      if (pAVar6->name != name) {
        *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
        return pAVar6;
      }
      *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
      if (*(int *)((long)parser + 0x1c8) == 0) {
        return pAVar6;
      }
      cVar2 = *name;
      if ((((cVar2 == 'x') && (pXVar5[2] == 'm')) && (pXVar5[3] == 'l')) &&
         ((pXVar5[4] == 'n' && (pXVar5[5] == 's')))) {
        if (pXVar5[6] == ':') {
          pPVar7 = (PREFIX *)lookup((HASH_TABLE *)((long)parser + 0x308),pXVar5 + 7,0x10);
        }
        else {
          if (pXVar5[6] != '\0') goto LAB_0046ea3d;
          pPVar7 = (PREFIX *)((long)parser + 0x390);
        }
        pAVar6->prefix = pPVar7;
        pAVar6->xmlns = '\x01';
        return pAVar6;
      }
LAB_0046ea3d:
      lVar8 = 0;
      while( true ) {
        if (cVar2 == '\0') {
          return pAVar6;
        }
        if (cVar2 == ':') break;
        cVar2 = pXVar5[lVar8 + 2];
        lVar8 = lVar8 + 1;
      }
      lVar9 = 0;
      while( true ) {
        pXVar5 = *(XML_Char **)((long)parser + 0x348);
        if (lVar8 == lVar9) break;
        if (pXVar5 == *(XML_Char **)((long)parser + 0x340)) {
          iVar3 = poolGrow(pool);
          if (iVar3 == 0) {
            return (ATTRIBUTE_ID *)0x0;
          }
          pXVar5 = *(XML_Char **)((long)parser + 0x348);
        }
        XVar1 = name[lVar9];
        *(XML_Char **)((long)parser + 0x348) = pXVar5 + 1;
        *pXVar5 = XVar1;
        lVar9 = lVar9 + 1;
      }
      if (pXVar5 == *(XML_Char **)((long)parser + 0x340)) {
        iVar3 = poolGrow(pool);
        if (iVar3 == 0) {
          return (ATTRIBUTE_ID *)0x0;
        }
        pXVar5 = *(XML_Char **)((long)parser + 0x348);
      }
      *(XML_Char **)((long)parser + 0x348) = pXVar5 + 1;
      *pXVar5 = '\0';
      pPVar7 = (PREFIX *)
               lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
      pAVar6->prefix = pPVar7;
      if (pPVar7->name == *(KEY *)((long)parser + 0x350)) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
        return pAVar6;
      }
      *(KEY *)((long)parser + 0x348) = *(KEY *)((long)parser + 0x350);
      return pAVar6;
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (!poolAppendChar(&dtd.pool, XML_T('\0')))
    return 0;
  name = poolStoreString(&dtd.pool, enc, start, end);
  if (!name)
    return 0;
  ++name;
  id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, name, sizeof(ATTRIBUTE_ID));
  if (!id)
    return 0;
  if (id->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!ns)
      ;
    else if (name[0] == 'x'
        && name[1] == 'm'
        && name[2] == 'l'
        && name[3] == 'n'
        && name[4] == 's'
        && (name[5] == XML_T('\0') || name[5] == XML_T(':'))) {
      if (name[5] == '\0')
        id->prefix = &dtd.defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(&dtd.prefixes, name + 6, sizeof(PREFIX));
      id->xmlns = 1;
    }
    else {
      int i;
      for (i = 0; name[i]; i++) {
        if (name[i] == XML_T(':')) {
          int j;
          for (j = 0; j < i; j++) {
            if (!poolAppendChar(&dtd.pool, name[j]))
              return 0;
          }
          if (!poolAppendChar(&dtd.pool, XML_T('\0')))
            return 0;
          id->prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
          if (id->prefix->name == poolStart(&dtd.pool))
            poolFinish(&dtd.pool);
          else
            poolDiscard(&dtd.pool);
          break;
        }
      }
    }
  }
  return id;
}